

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,string *name,char *regex,char *parentName)

{
  cmSourceGroupInternals *this_00;
  char *parentName_local;
  char *regex_local;
  string *name_local;
  cmSourceGroup *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->FullName);
  cmsys::RegularExpression::RegularExpression(&this->GroupRegex);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->GroupFiles);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            (&this->SourceFiles);
  this_00 = (cmSourceGroupInternals *)operator_new(0x18);
  cmSourceGroupInternals::cmSourceGroupInternals(this_00);
  this->Internal = this_00;
  SetGroupRegex(this,regex);
  if (parentName != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->FullName,parentName);
    std::__cxx11::string::operator+=((string *)&this->FullName,"\\");
  }
  std::__cxx11::string::operator+=((string *)&this->FullName,(string *)this);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(std::string name, const char* regex,
                             const char* parentName)
  : Name(std::move(name))
{
  this->Internal = new cmSourceGroupInternals;
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = parentName;
    this->FullName += "\\";
  }
  this->FullName += this->Name;
}